

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Detect.cpp
# Opt level: O2

bool checkMergeDels(string *chr1,int st1,int en1,string *chr2,int st2,int en2,double RO)

{
  bool bVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  
  bVar1 = std::operator!=(chr1,chr2);
  if (bVar1) {
    bVar2 = 0;
  }
  else {
    uVar3 = st1 - st2;
    iVar4 = st2;
    if (uVar3 != 0 && st2 <= st1) {
      iVar4 = st1;
    }
    uVar5 = -uVar3;
    if (0 < (int)uVar3) {
      uVar5 = uVar3;
    }
    uVar3 = en2 - en1;
    iVar6 = en1;
    if (en2 < en1) {
      iVar6 = en2;
    }
    if ((int)uVar3 < 0) {
      uVar3 = -uVar3;
    }
    bVar2 = -(RO <= (double)(iVar6 - iVar4) / (double)(en2 - st2)) &
            -(RO <= (double)(iVar6 - iVar4) / (double)(en1 - st1)) | (uVar3 < 6 && uVar5 < 6);
  }
  return (bool)(bVar2 & 1);
}

Assistant:

bool checkMergeDels(const std::string &chr1, int st1, int en1, const std::string &chr2, int st2, int en2, double RO)
{
	if (chr1 != chr2)
		return false;
	bool closeEnough = (abs(st1 - st2) <= DEL_MERGE_DIS) & (abs(en1 - en2) <= DEL_MERGE_DIS);
	double overlap = 1.0 * (std::min(en1, en2) - std::max(st1, st2));
	double len1 = 1.0 * (en1 - st1);
	double len2 = 1.0 * (en2 - st2);
	double ro1 = overlap / len1;
	double ro2 = overlap / len2;
	return ((ro1 >= RO && ro2 >= RO) | closeEnough);
}